

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

void __thiscall Fl_Text_Buffer::tab_distance(Fl_Text_Buffer *this,int tabDist)

{
  char *deletedText_00;
  char *deletedText;
  int tabDist_local;
  Fl_Text_Buffer *this_local;
  
  call_predelete_callbacks(this,0,this->mLength);
  this->mTabDist = tabDist;
  deletedText_00 = text(this);
  call_modify_callbacks(this,0,this->mLength,this->mLength,0,deletedText_00);
  free(deletedText_00);
  return;
}

Assistant:

void Fl_Text_Buffer::tab_distance(int tabDist)
{
  /* First call the pre-delete callbacks with the previous tab setting 
   still active. */
  call_predelete_callbacks(0, mLength);
  
  /* Change the tab setting */
  mTabDist = tabDist;
  
  /* Force any display routines to redisplay everything (unfortunately,
   this means copying the whole buffer contents to provide "deletedText" */
  const char *deletedText = text();
  call_modify_callbacks(0, mLength, mLength, 0, deletedText);
  free((void *) deletedText);
}